

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.cc
# Opt level: O0

float __thiscall Square::Gen(Square *this)

{
  Square *this_local;
  float local_4;
  
  if (6.2831855 <= (this->super_Oscillo).phase_) {
    (this->super_Oscillo).phase_ = (this->super_Oscillo).phase_ - 6.2831855;
  }
  (this->super_Oscillo).phase_ = (this->super_Oscillo).phase_incr_ + (this->super_Oscillo).phase_;
  if (3.1415927 <= (this->super_Oscillo).phase_) {
    local_4 = 1.0;
  }
  else {
    local_4 = -1.0;
  }
  return local_4;
}

Assistant:

float Square::Gen()
{
    if (this->phase_ >= M_TAU)
        this->phase_ -= M_TAU;

    this->phase_ += this->phase_incr_;

    if (this->phase_ < M_TAUOVR2)
        return -1.f;
    else
        return 1.f;
}